

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,DoWhileLoopStatement *stmt)

{
  DataFlowState *this_00;
  type oldBreakStates;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_238;
  DataFlowState local_210;
  SmallVector<slang::analysis::DataFlowState,_2UL> local_170;
  
  SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
            (&local_170,&(this->breakStates).super_SmallVectorBase<slang::analysis::DataFlowState>);
  SmallVectorBase<slang::analysis::DataFlowState>::clear
            (&(this->breakStates).super_SmallVectorBase<slang::analysis::DataFlowState>);
  ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(stmt->body,(DataFlowAnalysis *)this);
  visitCondition((ConstantValue *)&_Stack_238,this,stmt->cond);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&_Stack_238);
  this_00 = &local_210;
  DataFlowState::DataFlowState(this_00,&this->stateWhenFalse);
  loopTail(this,this_00,&local_170);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_210,
             (EVP_PKEY_CTX *)this_00);
  SmallVectorBase<slang::analysis::DataFlowState>::cleanup
            (&local_170.super_SmallVectorBase<slang::analysis::DataFlowState>,
             (EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

void visitStmt(const DoWhileLoopStatement& stmt) {
        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        visit(stmt.body);

        visitCondition(stmt.cond);

        loopTail(std::move(stateWhenFalse), std::move(oldBreakStates));
    }